

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O0

string<wchar_t> * __thiscall
irr::core::string<wchar_t>::append(string<wchar_t> *this,wchar_t *other,u32 length)

{
  ulong in_RSI;
  string<wchar_t> *in_RDI;
  u32 len;
  
  if (in_RSI != 0) {
    calclen((wchar_t *)0x3c4898);
    ::std::__cxx11::wstring::append((wchar_t *)in_RDI,in_RSI);
  }
  return in_RDI;
}

Assistant:

string<T> &append(const T *const other, u32 length = 0xffffffff)
	{
		if (!other)
			return *this;

		u32 len = calclen(other);
		if (len > length)
			len = length;

		str.append(other, len);
		return *this;
	}